

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

int miniros::set_non_blocking(socket_fd_t *socket)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar1 = fcntl(*socket,4,0x800);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar3 = *piVar2;
  }
  return iVar3;
}

Assistant:

int set_non_blocking(socket_fd_t& socket)
{
#ifdef WIN32
  u_long non_blocking = 1;
  if (ioctlsocket(socket, FIONBIO, &non_blocking) != 0) {
    return WSAGetLastError();
  }
#else
  if (fcntl(socket, F_SETFL, O_NONBLOCK) == -1) {
    return errno;
  }
#endif
  return 0;
}